

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlStrVPrintf(xmlChar *buf,int len,char *msg,__va_list_tag *ap)

{
  int ret;
  __va_list_tag *ap_local;
  char *msg_local;
  int len_local;
  xmlChar *buf_local;
  
  if ((buf == (xmlChar *)0x0) || (msg == (char *)0x0)) {
    buf_local._4_4_ = -1;
  }
  else {
    buf_local._4_4_ = vsnprintf((char *)buf,(long)len,msg,ap);
    buf[len + -1] = '\0';
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlStrVPrintf(xmlChar *buf, int len, const char *msg, va_list ap) {
    int ret;

    if((buf == NULL) || (msg == NULL)) {
        return(-1);
    }

    ret = vsnprintf((char *) buf, len, (const char *) msg, ap);
    buf[len - 1] = 0; /* be safe ! */

    return(ret);
}